

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O0

void __thiscall DRunningScript::Serialize(DRunningScript *this,FArchive *arc)

{
  FArchive *pFVar1;
  int local_1c;
  int i;
  FArchive *arc_local;
  DRunningScript *this_local;
  
  DObject::Serialize(&this->super_DObject,arc);
  pFVar1 = ::operator<<(arc,&this->script);
  pFVar1 = FArchive::operator<<(pFVar1,&this->save_point);
  pFVar1 = FArchive::operator<<(pFVar1,&this->wait_type);
  pFVar1 = FArchive::operator<<(pFVar1,&this->wait_data);
  pFVar1 = ::operator<<(pFVar1,&this->prev);
  pFVar1 = ::operator<<(pFVar1,&this->next);
  ::operator<<(pFVar1,&this->trigger);
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    ::operator<<(arc,this->variables + local_1c);
  }
  return;
}

Assistant:

void DRunningScript::Serialize(FArchive &arc)
{
	Super::Serialize(arc);

	arc << script << save_point << wait_type << wait_data << prev << next << trigger;
	for(int i=0; i< VARIABLESLOTS; i++) arc << variables[i];
}